

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.h
# Opt level: O1

Expr * __thiscall Program::makeExpr<StackAlloc,Value*&>(Program *this,Value **args)

{
  tuple<Expr_*,_std::default_delete<Expr>_> this_00;
  Expr *pEVar1;
  __uniq_ptr_impl<Expr,_std::default_delete<Expr>_> local_20;
  
  this_00.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
  super__Head_base<0UL,_Expr_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>)operator_new(0x20);
  StackAlloc::StackAlloc
            ((StackAlloc *)
             this_00.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
             super__Head_base<0UL,_Expr_*,_false>._M_head_impl,*args);
  local_20._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
  super__Head_base<0UL,_Expr_*,_false>._M_head_impl =
       (tuple<Expr_*,_std::default_delete<Expr>_>)
       (tuple<Expr_*,_std::default_delete<Expr>_>)
       this_00.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
       super__Head_base<0UL,_Expr_*,_false>._M_head_impl;
  pEVar1 = addOwnership(this,(unique_ptr<Expr,_std::default_delete<Expr>_> *)&local_20);
  if ((_Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>)
      local_20._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
      super__Head_base<0UL,_Expr_*,_false>._M_head_impl != (Expr *)0x0) {
    (**(code **)(*(long *)local_20._M_t.super__Tuple_impl<0UL,_Expr_*,_std::default_delete<Expr>_>.
                          super__Head_base<0UL,_Expr_*,_false>._M_head_impl + 8))();
  }
  return pEVar1;
}

Assistant:

Expr* makeExpr(Args&&... args) {
        return addOwnership(std::make_unique<T>(std::forward<Args>(args)...));
    }